

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpt.cpp
# Opt level: O1

bool __thiscall pg::QPTSolver::lift(QPTSolver *this,int v,int target)

{
  int iVar1;
  int iVar2;
  int iVar3;
  _func_int *p_Var4;
  char cVar5;
  ostream *poVar6;
  Game *pGVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  char *pcVar11;
  long lVar12;
  int *piVar13;
  _label_vertex *p_Var14;
  int *a;
  int *piVar15;
  int to;
  uint uVar16;
  ulong uVar17;
  int *piVar18;
  uint k;
  int *piVar19;
  bool bVar20;
  int aiStack_c0 [2];
  ulong uStack_b8;
  int aiStack_b0 [2];
  _label_vertex local_a8;
  ulong local_98;
  ulong local_90;
  undefined1 *local_88;
  _label_vertex local_80;
  uint local_70;
  int local_6c;
  _label_vertex local_68;
  int *local_58;
  int *local_50;
  ulong local_48;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  iVar9 = this->k * v;
  uVar16 = this->pm_nodes[iVar9];
  if ((uVar16 != 0xffffffff) && ((uVar16 & 1) == this->pl)) {
    return false;
  }
  local_88 = (undefined1 *)&local_a8;
  local_50 = this->pm_nodes + iVar9;
  local_38 = v;
  uVar17 = (ulong)v;
  local_6c = ((this->super_Solver).game)->_priority[uVar17];
  piVar15 = (int *)((long)&local_a8 - ((ulong)(uint)this->k * 4 + 0xf & 0xfffffffffffffff0));
  piVar19 = (int *)((long)piVar15 - ((ulong)(uint)this->k * 4 + 0xf & 0xfffffffffffffff0));
  local_70 = this->strategy[uVar17];
  local_58 = piVar19;
  piVar18 = piVar19;
  if (1 < (this->super_Solver).trace) {
    poVar6 = (this->super_Solver).logger;
    piVar19[-2] = 0x168b97;
    piVar19[-1] = 0;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[37;1mupdating vertex ",0x17);
    local_68.g = (this->super_Solver).game;
    local_68.v = v;
    piVar19[-2] = 0x168bae;
    piVar19[-1] = 0;
    poVar6 = operator<<(poVar6,&local_68);
    bVar20 = ((((this->super_Solver).game)->_owner)._bits[uVar17 >> 6] >> (uVar17 & 0x3f) & 1) != 0;
    pcVar11 = " (odd)";
    if (!bVar20) {
      pcVar11 = " (even)";
    }
    piVar19[-2] = 0x168beb;
    piVar19[-1] = 0;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar11,7 - (ulong)bVar20);
    piVar19[-2] = 0x168bff;
    piVar19[-1] = 0;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[m with current measure",0x18);
    piVar18 = local_50;
    poVar6 = (this->super_Solver).logger;
    iVar9 = this->k;
    piVar19[-2] = 0x168c0f;
    piVar19[-1] = 0;
    pm_stream(poVar6,piVar18,iVar9);
    poVar6 = (this->super_Solver).logger;
    p_Var4 = poVar6->_vptr_basic_ostream[-3];
    cVar5 = (char)poVar6;
    piVar19[-2] = 0x168c27;
    piVar19[-1] = 0;
    std::ios::widen((char)p_Var4 + cVar5);
    piVar18 = local_58;
    piVar19[-2] = 0x168c36;
    piVar19[-1] = 0;
    std::ostream::put(cVar5);
    piVar19[-2] = 0x168c3e;
    piVar19[-1] = 0;
    std::ostream::flush();
  }
  iVar9 = local_6c;
  if (target == -1) {
LAB_00168cf9:
    uVar16 = this->strategy[uVar17];
    local_3c = uVar16;
    if (uVar16 == 0xffffffff) {
      local_34 = (uint)CONCAT71((int7)((ulong)this->strategy >> 8),1);
    }
    else {
      iVar1 = this->k;
      piVar13 = this->pm_nodes;
      iVar2 = this->max;
      iVar3 = this->maxo;
      *(ulong *)(piVar19 + -4) = (ulong)(uint)this->pl;
      piVar19[-6] = 0x168d37;
      piVar19[-5] = 0;
      au(piVar15,piVar13 + (int)(iVar1 * uVar16),iVar9,iVar1,iVar2,iVar3,piVar19[-4]);
      if ((long)this->k < 1) {
        uVar8 = 0;
      }
      else {
        lVar12 = 0;
        uVar8 = 0;
        do {
          uVar8 = (ulong)((piVar15[lVar12] & 1U) == this->pl && piVar15[lVar12] != 0xffffffff) +
                  uVar8 * 2;
          lVar12 = lVar12 + 1;
        } while (this->k != lVar12);
      }
      if (this->goal < uVar8) {
        *piVar15 = this->max;
      }
      if (1 < (this->super_Solver).trace) {
        poVar6 = (this->super_Solver).logger;
        piVar19[-2] = 0x168daf;
        piVar19[-1] = 0;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"to successor ",0xd);
        uVar16 = local_3c;
        local_68.g = (this->super_Solver).game;
        local_68.v = local_3c;
        piVar19[-2] = 0x168dca;
        piVar19[-1] = 0;
        poVar6 = operator<<(poVar6,&local_68);
        piVar19[-2] = 0x168dde;
        piVar19[-1] = 0;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
        poVar6 = (this->super_Solver).logger;
        iVar9 = this->k;
        piVar18 = this->pm_nodes;
        piVar19[-2] = 0x168dfb;
        piVar19[-1] = 0;
        pm_stream(poVar6,piVar18 + (int)(iVar9 * uVar16),iVar9);
        poVar6 = (this->super_Solver).logger;
        piVar19[-2] = 0x168e10;
        piVar19[-1] = 0;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," => ",4);
        poVar6 = (this->super_Solver).logger;
        iVar9 = this->k;
        piVar19[-2] = 0x168e1f;
        piVar19[-1] = 0;
        pm_stream(poVar6,piVar15,iVar9);
        poVar6 = (this->super_Solver).logger;
        p_Var4 = poVar6->_vptr_basic_ostream[-3];
        cVar5 = (char)poVar6;
        piVar19[-2] = 0x168e37;
        piVar19[-1] = 0;
        std::ios::widen((char)p_Var4 + cVar5);
        piVar18 = local_58;
        piVar19[-2] = 0x168e46;
        piVar19[-1] = 0;
        std::ostream::put(cVar5);
        piVar19[-2] = 0x168e4e;
        piVar19[-1] = 0;
        std::ostream::flush();
      }
      iVar9 = this->k;
      if (0 < (long)iVar9) {
        piVar19[-2] = 0x168e66;
        piVar19[-1] = 0;
        memcpy(piVar18,piVar15,(long)iVar9 << 2);
      }
      local_34 = 0;
    }
    pGVar7 = (this->super_Solver).game;
    piVar18 = pGVar7->_outedges;
    local_48 = uVar17;
    iVar9 = pGVar7->_firstouts[uVar17];
    uVar16 = piVar18[iVar9];
    if (uVar16 != 0xffffffff) {
      piVar18 = piVar18 + iVar9;
      local_98 = uVar17 >> 6;
      local_90 = 1L << (uVar17 & 0x3f);
      uVar10 = local_3c;
      do {
        iVar9 = local_6c;
        if ((uVar16 != uVar10) &&
           ((1L << ((long)(int)uVar16 & 0x3fU) &
            ((this->super_Solver).disabled)->_bits[(ulong)(long)(int)uVar16 >> 6]) == 0)) {
          iVar1 = this->k;
          piVar13 = this->pm_nodes;
          iVar2 = this->max;
          iVar3 = this->maxo;
          *(ulong *)(piVar19 + -4) = (ulong)(uint)this->pl;
          piVar19[-6] = 0x168f13;
          piVar19[-5] = 0;
          au(piVar15,piVar13 + (int)(iVar1 * uVar16),iVar9,iVar1,iVar2,iVar3,piVar19[-4]);
          if ((long)this->k < 1) {
            uVar17 = 0;
          }
          else {
            lVar12 = 0;
            uVar17 = 0;
            do {
              uVar17 = (ulong)((piVar15[lVar12] & 1U) == this->pl && piVar15[lVar12] != 0xffffffff)
                       + uVar17 * 2;
              lVar12 = lVar12 + 1;
            } while (this->k != lVar12);
          }
          if (this->goal < uVar17) {
            *piVar15 = this->max;
          }
          if (1 < (this->super_Solver).trace) {
            poVar6 = (this->super_Solver).logger;
            piVar19[-2] = 0x168f81;
            piVar19[-1] = 0;
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"to successor ",0xd);
            local_68.g = (this->super_Solver).game;
            local_68.v = uVar16;
            piVar19[-2] = 0x168f99;
            piVar19[-1] = 0;
            poVar6 = operator<<(poVar6,&local_68);
            piVar19[-2] = 0x168fad;
            piVar19[-1] = 0;
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
            poVar6 = (this->super_Solver).logger;
            iVar9 = this->k;
            piVar13 = this->pm_nodes;
            piVar19[-2] = 0x168fca;
            piVar19[-1] = 0;
            pm_stream(poVar6,piVar13 + (int)(iVar9 * uVar16),iVar9);
            poVar6 = (this->super_Solver).logger;
            piVar19[-2] = 0x168fdf;
            piVar19[-1] = 0;
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," => ",4);
            poVar6 = (this->super_Solver).logger;
            iVar9 = this->k;
            piVar19[-2] = 0x168fee;
            piVar19[-1] = 0;
            pm_stream(poVar6,piVar15,iVar9);
            poVar6 = (this->super_Solver).logger;
            p_Var4 = poVar6->_vptr_basic_ostream[-3];
            cVar5 = (char)poVar6;
            piVar19[-2] = 0x169006;
            piVar19[-1] = 0;
            std::ios::widen((char)p_Var4 + cVar5);
            piVar19[-2] = 0x169011;
            piVar19[-1] = 0;
            std::ostream::put(cVar5);
            piVar19[-2] = 0x169019;
            piVar19[-1] = 0;
            std::ostream::flush();
          }
          if ((local_34 & 1) == 0) {
            uVar10 = this->pl;
            k = this->k;
            piVar13 = local_58;
            a = piVar15;
            if (uVar10 == (((((this->super_Solver).game)->_owner)._bits[local_98] & local_90) != 0))
            {
              piVar13 = piVar15;
              a = local_58;
            }
            piVar19[-2] = 0x16906e;
            piVar19[-1] = 0;
            bVar20 = pm_less(a,piVar13,k,uVar10);
            uVar10 = local_3c;
            if (!bVar20) goto LAB_00169099;
          }
          else {
            k = this->k;
            local_34 = 0;
          }
          piVar13 = local_58;
          if (0 < (int)k) {
            piVar19[-2] = 0x16908a;
            piVar19[-1] = 0;
            memcpy(piVar13,piVar15,(ulong)k << 2);
          }
          this->strategy[local_48] = uVar16;
          uVar10 = local_3c;
        }
LAB_00169099:
        uVar16 = piVar18[1];
        piVar18 = piVar18 + 1;
      } while (uVar16 != 0xffffffff);
    }
    piVar15 = local_50;
    piVar18 = local_58;
    uVar16 = this->pl;
    iVar9 = this->k;
    piVar19[-2] = 0x1690c2;
    piVar19[-1] = 0;
    bVar20 = pm_less(piVar15,piVar18,iVar9,uVar16);
    uVar10 = local_70;
    if (bVar20) {
      if (0 < this->k) {
        lVar12 = 0;
        do {
          local_50[lVar12] = local_58[lVar12];
          lVar12 = lVar12 + 1;
        } while (lVar12 < this->k);
      }
      if (((this->super_Solver).trace != 0) && (local_70 != this->strategy[local_48])) {
        poVar6 = (this->super_Solver).logger;
        if (this->pl ==
            (uint)(((((this->super_Solver).game)->_owner)._bits[local_48 >> 6] >> (local_48 & 0x3f)
                   & 1) != 0)) {
          pcVar11 = "\x1b[1;38;5;208m";
          lVar12 = 0xd;
        }
        else {
          pcVar11 = "\x1b[1;31m";
          lVar12 = 7;
        }
        piVar19[-2] = 0x1693c1;
        piVar19[-1] = 0;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar11,lVar12);
        poVar6 = (this->super_Solver).logger;
        if (uVar10 == 0xffffffff) {
          piVar19[-2] = 0x16951c;
          piVar19[-1] = 0;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,"set strategy\x1b[m of \x1b[36;1m",0x1a);
          local_68.g = (this->super_Solver).game;
          local_68.v = local_38;
          piVar19[-2] = 0x169535;
          piVar19[-1] = 0;
          poVar6 = operator<<(poVar6,&local_68);
          piVar19[-2] = 0x16954c;
          piVar19[-1] = 0;
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[m to \x1b[36;1m",0xe);
          pGVar7 = (this->super_Solver).game;
          iVar9 = this->strategy[local_48];
          p_Var14 = &local_80;
        }
        else {
          piVar19[-2] = 0x1693e3;
          piVar19[-1] = 0;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,"changed strategy\x1b[m of \x1b[36;1m",0x1e);
          local_68.g = (this->super_Solver).game;
          local_68.v = local_38;
          piVar19[-2] = 0x1693fc;
          piVar19[-1] = 0;
          poVar6 = operator<<(poVar6,&local_68);
          piVar19[-2] = 0x169413;
          piVar19[-1] = 0;
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[m from \x1b[36;1m",0x10);
          local_80.g = (this->super_Solver).game;
          local_80.v = uVar10;
          piVar19[-2] = 0x16942a;
          piVar19[-1] = 0;
          poVar6 = operator<<(poVar6,&local_80);
          piVar19[-2] = 0x169441;
          piVar19[-1] = 0;
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[m to \x1b[36;1m",0xe);
          pGVar7 = (this->super_Solver).game;
          iVar9 = this->strategy[local_48];
          p_Var14 = &local_a8;
        }
        p_Var14->g = pGVar7;
        p_Var14->v = iVar9;
        piVar19[-2] = 0x16956d;
        piVar19[-1] = 0;
        poVar6 = operator<<(poVar6,p_Var14);
        piVar19[-2] = 0x169581;
        piVar19[-1] = 0;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[m\n",4);
      }
      piVar18 = local_50;
      if ((this->super_Solver).trace == 0) {
        return bVar20;
      }
      poVar6 = (this->super_Solver).logger;
      piVar19[-2] = 0x1695a7;
      piVar19[-1] = 0;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"\x1b[1;32mnew measure\x1b[m of \x1b[36;1m",0x20);
      local_68.g = (this->super_Solver).game;
      local_68.v = local_38;
      piVar19[-2] = 0x1695c4;
      piVar19[-1] = 0;
      poVar6 = operator<<(poVar6,&local_68);
      piVar19[-2] = 0x1695d8;
      piVar19[-1] = 0;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[m:",4);
      poVar6 = (this->super_Solver).logger;
      iVar9 = this->k;
      piVar19[-2] = 0x1695e7;
      piVar19[-1] = 0;
      pm_stream(poVar6,piVar18,iVar9);
      poVar6 = (this->super_Solver).logger;
      piVar19[-2] = 0x1695ff;
      piVar19[-1] = 0;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," (to ",5);
      local_68.g = (this->super_Solver).game;
      local_68.v = this->strategy[local_48];
LAB_001697a0:
      piVar19[-2] = 0x1697ac;
      piVar19[-1] = 0;
      poVar6 = operator<<(poVar6,&local_68);
      pcVar11 = ")\n";
      lVar12 = 2;
    }
    else {
      if ((this->super_Solver).trace == 0) {
        return bVar20;
      }
      if (local_70 == this->strategy[local_48]) {
        return bVar20;
      }
      poVar6 = (this->super_Solver).logger;
      if (uVar16 == (((((this->super_Solver).game)->_owner)._bits[local_48 >> 6] >>
                      (local_48 & 0x3f) & 1) != 0)) {
        pcVar11 = "\x1b[1;38;5;208m";
        lVar12 = 0xd;
      }
      else {
        pcVar11 = "\x1b[1;31m";
        lVar12 = 7;
      }
      piVar19[-2] = 0x16946d;
      piVar19[-1] = 0;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar11,lVar12);
      poVar6 = (this->super_Solver).logger;
      if (uVar10 == 0xffffffff) {
        piVar19[-2] = 0x16962e;
        piVar19[-1] = 0;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"set strategy\x1b[m of \x1b[36;1m",0x1a);
        local_68.g = (this->super_Solver).game;
        local_68.v = local_38;
        piVar19[-2] = 0x169647;
        piVar19[-1] = 0;
        poVar6 = operator<<(poVar6,&local_68);
        piVar19[-2] = 0x16965e;
        piVar19[-1] = 0;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[m to \x1b[36;1m",0xe);
        pGVar7 = (this->super_Solver).game;
        iVar9 = this->strategy[local_48];
        p_Var14 = &local_80;
      }
      else {
        piVar19[-2] = 0x16948f;
        piVar19[-1] = 0;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"changed strategy\x1b[m of \x1b[36;1m",0x1e);
        local_68.g = (this->super_Solver).game;
        local_68.v = local_38;
        piVar19[-2] = 0x1694a8;
        piVar19[-1] = 0;
        poVar6 = operator<<(poVar6,&local_68);
        piVar19[-2] = 0x1694bf;
        piVar19[-1] = 0;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[m from \x1b[36;1m",0x10);
        local_80.g = (this->super_Solver).game;
        local_80.v = uVar10;
        piVar19[-2] = 0x1694d6;
        piVar19[-1] = 0;
        poVar6 = operator<<(poVar6,&local_80);
        piVar19[-2] = 0x1694ed;
        piVar19[-1] = 0;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[m to \x1b[36;1m",0xe);
        pGVar7 = (this->super_Solver).game;
        iVar9 = this->strategy[local_48];
        p_Var14 = &local_a8;
      }
      p_Var14->g = pGVar7;
      p_Var14->v = iVar9;
      piVar19[-2] = 0x16967f;
      piVar19[-1] = 0;
      poVar6 = operator<<(poVar6,p_Var14);
      pcVar11 = "\x1b[m\n";
      lVar12 = 4;
    }
    piVar19[-2] = 0x1697c0;
    piVar19[-1] = 0;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar11,lVar12);
  }
  else {
    if (this->pl ==
        (uint)(((((this->super_Solver).game)->_owner)._bits[uVar17 >> 6] >> (uVar17 & 0x3f) & 1) !=
              0)) {
      iVar1 = this->k;
      iVar2 = this->max;
      local_34 = target;
      piVar18 = this->pm_nodes;
      iVar3 = this->maxo;
      *(ulong *)(piVar19 + -4) = (ulong)(uint)this->pl;
      piVar19[-6] = 0x168c99;
      piVar19[-5] = 0;
      au(piVar15,piVar18 + iVar1 * target,iVar9,iVar1,iVar2,iVar3,piVar19[-4]);
      if ((long)this->k < 1) {
        uVar8 = 0;
      }
      else {
        lVar12 = 0;
        uVar8 = 0;
        do {
          uVar8 = (ulong)((piVar15[lVar12] & 1U) == this->pl && piVar15[lVar12] != 0xffffffff) +
                  uVar8 * 2;
          lVar12 = lVar12 + 1;
        } while (this->k != lVar12);
      }
      if (this->goal < uVar8) {
        *piVar15 = this->max;
      }
      if (1 < (this->super_Solver).trace) {
        poVar6 = (this->super_Solver).logger;
        piVar19[-2] = 0x1691d7;
        piVar19[-1] = 0;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"to successor ",0xd);
        uVar16 = local_34;
        local_68.g = (this->super_Solver).game;
        local_68.v = local_34;
        piVar19[-2] = 0x1691f2;
        piVar19[-1] = 0;
        poVar6 = operator<<(poVar6,&local_68);
        piVar19[-2] = 0x169206;
        piVar19[-1] = 0;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
        poVar6 = (this->super_Solver).logger;
        iVar9 = this->k;
        piVar18 = this->pm_nodes;
        piVar19[-2] = 0x169223;
        piVar19[-1] = 0;
        pm_stream(poVar6,piVar18 + (int)(iVar9 * uVar16),iVar9);
        poVar6 = (this->super_Solver).logger;
        piVar19[-2] = 0x169238;
        piVar19[-1] = 0;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," => ",4);
        poVar6 = (this->super_Solver).logger;
        iVar9 = this->k;
        piVar19[-2] = 0x169247;
        piVar19[-1] = 0;
        pm_stream(poVar6,piVar15,iVar9);
        poVar6 = (this->super_Solver).logger;
        p_Var4 = poVar6->_vptr_basic_ostream[-3];
        cVar5 = (char)poVar6;
        piVar19[-2] = 0x16925f;
        piVar19[-1] = 0;
        std::ios::widen((char)p_Var4 + cVar5);
        piVar19[-2] = 0x16926d;
        piVar19[-1] = 0;
        std::ostream::put(cVar5);
        piVar19[-2] = 0x169275;
        piVar19[-1] = 0;
        std::ostream::flush();
      }
      piVar18 = local_50;
      iVar9 = this->pl;
      iVar1 = this->k;
      piVar19[-2] = 0x169287;
      piVar19[-1] = 0;
      bVar20 = pm_less(piVar18,piVar15,iVar1,iVar9);
      if (bVar20) {
        if (0 < this->k) {
          lVar12 = 0;
          do {
            local_50[lVar12] = piVar15[lVar12];
            lVar12 = lVar12 + 1;
          } while (lVar12 < this->k);
        }
        uVar16 = local_34;
        if (((this->super_Solver).trace != 0) &&
           (uVar10 = this->strategy[uVar17], uVar10 != local_34)) {
          poVar6 = (this->super_Solver).logger;
          piVar19[-2] = 0x1692e6;
          piVar19[-1] = 0;
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;38;5;208m",0xd);
          poVar6 = (this->super_Solver).logger;
          if (uVar10 == 0xffffffff) {
            piVar19[-2] = 0x1696a4;
            piVar19[-1] = 0;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6,"set strategy\x1b[m of \x1b[36;1m",0x1a);
            local_68.g = (this->super_Solver).game;
            local_68.v = local_38;
            piVar19[-2] = 0x1696bd;
            piVar19[-1] = 0;
            poVar6 = operator<<(poVar6,&local_68);
            piVar19[-2] = 0x1696d4;
            piVar19[-1] = 0;
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[m to \x1b[36;1m",0xe);
            uVar16 = local_34;
            local_80.g = (this->super_Solver).game;
            local_80.v = local_34;
            piVar19[-2] = 0x1696ef;
            piVar19[-1] = 0;
            poVar6 = operator<<(poVar6,&local_80);
            piVar19[-2] = 0x169703;
            piVar19[-1] = 0;
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[m\n",4);
          }
          else {
            piVar19[-2] = 0x169308;
            piVar19[-1] = 0;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6,"changed strategy\x1b[m of \x1b[36;1m",0x1e);
            local_68.g = (this->super_Solver).game;
            local_68.v = v;
            piVar19[-2] = 0x16931f;
            piVar19[-1] = 0;
            poVar6 = operator<<(poVar6,&local_68);
            piVar19[-2] = 0x169336;
            piVar19[-1] = 0;
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[m from \x1b[36;1m",0x10)
            ;
            local_80.g = (this->super_Solver).game;
            local_80.v = this->strategy[uVar17];
            piVar19[-2] = 0x169354;
            piVar19[-1] = 0;
            poVar6 = operator<<(poVar6,&local_80);
            piVar19[-2] = 0x16936b;
            piVar19[-1] = 0;
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[m to \x1b[36;1m",0xe);
            uVar16 = local_34;
            local_a8.g = (this->super_Solver).game;
            local_a8.v = local_34;
            piVar19[-2] = 0x16938c;
            piVar19[-1] = 0;
            poVar6 = operator<<(poVar6,&local_a8);
            piVar19[-2] = 0x1693a0;
            piVar19[-1] = 0;
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[m\n",4);
          }
        }
        piVar18 = local_50;
        this->strategy[uVar17] = uVar16;
        bVar20 = true;
        if ((this->super_Solver).trace == 0) {
          return true;
        }
        poVar6 = (this->super_Solver).logger;
        piVar19[-2] = 0x16973a;
        piVar19[-1] = 0;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"\x1b[1;32mnew measure\x1b[m of \x1b[36;1m",0x20);
        local_68.g = (this->super_Solver).game;
        local_68.v = local_38;
        piVar19[-2] = 0x169757;
        piVar19[-1] = 0;
        poVar6 = operator<<(poVar6,&local_68);
        piVar19[-2] = 0x16976b;
        piVar19[-1] = 0;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[m:",4);
        poVar6 = (this->super_Solver).logger;
        iVar9 = this->k;
        piVar19[-2] = 0x16977a;
        piVar19[-1] = 0;
        pm_stream(poVar6,piVar18,iVar9);
        poVar6 = (this->super_Solver).logger;
        piVar19[-2] = 0x169792;
        piVar19[-1] = 0;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," (to ",5);
        local_68.g = (this->super_Solver).game;
        local_68.v = local_34;
        goto LAB_001697a0;
      }
    }
    else if (this->strategy[uVar17] == -1 || this->strategy[uVar17] == target) goto LAB_00168cf9;
    bVar20 = false;
  }
  return bVar20;
}

Assistant:

bool
QPTSolver::lift(int v, int target)
{
    // check if already Top
    int * const pm = pm_nodes + k*v; // obtain ptr to current progress measure
    if (pm[0] != -1 and (pm[0]&1) == pl) return false;

    const int pr = priority(v);
    int tmp[k], res[k];

#ifndef NDEBUG
    int old_strategy = strategy[v];

    if (trace >= 2) {
        logger << "\033[37;1mupdating vertex " << label_vertex(v) << (owner(v)?" (odd)":" (even)") << "\033[m with current measure";
        pm_stream(logger, pm, k);
        logger << std::endl;
    }
#endif

    // First special cases if we are lifting triggered by a given <target>.

    if (1 and target != -1) {
        if (owner(v) == pl) {
            // if owned by <pl>, just check if target is better.
            au(tmp, pm_nodes + k*target, pr, k, max, maxo, pl);
            if (pm_val(tmp, k, pl) > goal) tmp[0] = max; // lol
#ifndef NDEBUG
            if (trace >= 2) {
                logger << "to successor " << label_vertex(target) << ":";
                pm_stream(logger, pm_nodes + k*target, k);
                logger << " => ";
                pm_stream(logger, tmp, k);
                logger << std::endl;
            }
#endif
            if (pm_less(pm, tmp, k, pl)) {
                // target is better, update, report, return
                for (int i=0; i<k; i++) pm[i] = tmp[i];
#ifndef NDEBUG
                if (trace and target != strategy[v]) {
                    if (strategy[v] == -1) {
                        logger << "\033[1;38;5;208m";
                        logger << "set strategy\033[m of \033[36;1m" << label_vertex(v) << "\033[m to \033[36;1m" << label_vertex(target) << "\033[m\n";
                    } else {
                        logger << "\033[1;38;5;208m";
                        logger << "changed strategy\033[m of \033[36;1m" << label_vertex(v) << "\033[m from \033[36;1m" << label_vertex(strategy[v]) << "\033[m to \033[36;1m" << label_vertex(target) << "\033[m\n";
                    }
                }
                strategy[v] = target; // does not matter for algorithm, only for output here
#endif
#ifndef NDEBUG
                if (trace) {
                    logger << "\033[1;32mnew measure\033[m of \033[36;1m" << label_vertex(v) << "\033[m:";
                    pm_stream(logger, pm, k);
                    logger << " (to " << label_vertex(target) << ")\n";
                }
#endif
                return true;
            } else {
                // target not better, not checking other directions
                return false;
            }
        } else {
            // if owned by ~<pl>, test if strategy is target
            if (strategy[v] != -1 and target != strategy[v]) {
                return false; // no need to do anything... strategy is still same
            }
        }
    }

    // Compute best measure by going over all successors

    bool first = true;
    int s_cur = strategy[v];
    if (s_cur != -1) {
        // first set to current...
        au(tmp, pm_nodes + k*s_cur, pr, k, max, maxo, pl);
        if (pm_val(tmp, k, pl) > goal) tmp[0] = max; // goal reached, lift to Top
#ifndef NDEBUG
        if (trace >= 2) {
            logger << "to successor " << label_vertex(s_cur) << ":";
            pm_stream(logger, pm_nodes + k*s_cur, k);
            logger << " => ";
            pm_stream(logger, tmp, k);
            logger << std::endl;
        }
#endif
        for (int i=0; i<k; i++) res[i] = tmp[i];
        first = false;
    }
    for (auto curedge = outs(v); *curedge != -1; curedge++) {
        int to = *curedge;
        if (disabled[to]) continue;
        if (to == s_cur) continue;
        au(tmp, pm_nodes + k*to, pr, k, max, maxo, pl);
        if (pm_val(tmp, k, pl) > goal) tmp[0] = max; // goal reached, lift to Top
#ifndef NDEBUG
        if (trace >= 2) {
            logger << "to successor " << label_vertex(to) << ":";
            pm_stream(logger, pm_nodes + k*to, k);
            logger << " => ";
            pm_stream(logger, tmp, k);
            logger << std::endl;
        }
#endif
        if (first) {
            first = false;
            for (int i=0; i<k; i++) res[i] = tmp[i];
            strategy[v] = to;
        } else if (owner(v) == pl) {
            // we want the max
            if (pm_less(res, tmp, k, pl)) {
                for (int i=0; i<k; i++) res[i] = tmp[i];
                strategy[v] = to;
            }
        } else {
            // we want the min
            if (pm_less(tmp, res, k, pl)) {
                for (int i=0; i<k; i++) res[i] = tmp[i];
                strategy[v] = to;
            }
        }
    }

    // now "res" contains the best au
    if (pm_less(pm, res, k, pl)) {
        // ok, it's an update
        for (int i=0; i<k; i++) pm[i] = res[i];
#ifndef NDEBUG
        if (trace and old_strategy != strategy[v]) {
            if (owner(v) == pl) logger << "\033[1;38;5;208m";
            else logger << "\033[1;31m";
            if (old_strategy == -1) {
                logger << "set strategy\033[m of \033[36;1m" << label_vertex(v) << "\033[m to \033[36;1m" << label_vertex(strategy[v]) << "\033[m\n";
            } else {
                logger << "changed strategy\033[m of \033[36;1m" << label_vertex(v) << "\033[m from \033[36;1m" << label_vertex(old_strategy) << "\033[m to \033[36;1m" << label_vertex(strategy[v]) << "\033[m\n";
            }
        }
        if (trace) {
            logger << "\033[1;32mnew measure\033[m of \033[36;1m" << label_vertex(v) << "\033[m:";
            pm_stream(logger, pm, k);
            logger << " (to " << label_vertex(strategy[v]) << ")\n";
        }
#endif
        return true;
    } else {
#ifndef NDEBUG
        if (trace and old_strategy != strategy[v]) {
            if (owner(v) == pl) logger << "\033[1;38;5;208m";
            else logger << "\033[1;31m";
            if (old_strategy == -1) {
                logger << "set strategy\033[m of \033[36;1m" << label_vertex(v) << "\033[m to \033[36;1m" << label_vertex(strategy[v]) << "\033[m\n";
            } else {
                logger << "changed strategy\033[m of \033[36;1m" << label_vertex(v) << "\033[m from \033[36;1m" << label_vertex(old_strategy) << "\033[m to \033[36;1m" << label_vertex(strategy[v]) << "\033[m\n";
            }
        }
#endif
        return false;
    }
}